

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_early_data_add_serverhello(SSL_HANDSHAKE *hs,CBB *out)

{
  int iVar1;
  CBB *out_local;
  SSL_HANDSHAKE *hs_local;
  
  if ((*(ushort *)&hs->ssl->s3->field_0xdc >> 9 & 1) == 0) {
    hs_local._7_1_ = true;
  }
  else {
    iVar1 = CBB_add_u16(out,0x2a);
    if (((iVar1 != 0) && (iVar1 = CBB_add_u16(out,0), iVar1 != 0)) &&
       (iVar1 = CBB_flush(out), iVar1 != 0)) {
      return true;
    }
    hs_local._7_1_ = false;
  }
  return hs_local._7_1_;
}

Assistant:

static bool ext_early_data_add_serverhello(SSL_HANDSHAKE *hs, CBB *out) {
  if (!hs->ssl->s3->early_data_accepted) {
    return true;
  }

  if (!CBB_add_u16(out, TLSEXT_TYPE_early_data) ||  //
      !CBB_add_u16(out, 0) ||                       //
      !CBB_flush(out)) {
    return false;
  }

  return true;
}